

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

jsgf_rule_t * jsgf_optional_new(jsgf_t *jsgf,jsgf_rhs_t *exp)

{
  jsgf_rhs_t *rhs;
  jsgf_atom_t *ptr;
  glist_t pgVar1;
  jsgf_rule_t *pjVar2;
  
  rhs = (jsgf_rhs_t *)
        __ckd_calloc__(1,0x10,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                       ,0xb5);
  ptr = jsgf_atom_new("<NULL>",1.0);
  rhs->alt = exp;
  pgVar1 = glist_add_ptr((glist_t)0x0,ptr);
  rhs->atoms = pgVar1;
  pjVar2 = jsgf_define_rule(jsgf,(char *)0x0,rhs,0);
  return pjVar2;
}

Assistant:

jsgf_rule_t *
jsgf_optional_new(jsgf_t * jsgf, jsgf_rhs_t * exp)
{
    jsgf_rhs_t *rhs = ckd_calloc(1, sizeof(*rhs));
    jsgf_atom_t *atom = jsgf_atom_new("<NULL>", 1.0);
    rhs->alt = exp;
    rhs->atoms = glist_add_ptr(NULL, atom);
    return jsgf_define_rule(jsgf, NULL, rhs, 0);
}